

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<float> * __thiscall
TPZFMatrix<float>::operator+
          (TPZFMatrix<float> *__return_storage_ptr__,TPZFMatrix<float> *this,float value)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  
  TPZFMatrix(__return_storage_ptr__,this);
  lVar2 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (0 < lVar2) {
    pfVar3 = __return_storage_ptr__->fElem;
    pfVar1 = pfVar3 + lVar2;
    do {
      *pfVar3 = *pfVar3 + value;
      pfVar3 = pfVar3 + 1;
    } while (pfVar3 < pfVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}